

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParserTest.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::MakefileDepsParserTest_basic_Test::TestBody()::Testactions::error(llvm::
StringRef_unsigned_long_(void *this,StringRef message,uint64_t position)

{
  string local_48;
  uint64_t local_28;
  uint64_t position_local;
  Testactions *this_local;
  StringRef message_local;
  
  message_local.Data = (char *)message.Length;
  this_local = (Testactions *)message.Data;
  local_28 = position;
  position_local = (uint64_t)this;
  llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)&this_local);
  std::
  vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
  ::emplace_back<std::__cxx11::string,unsigned_long&>
            ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
              *)((long)this + 0x20),&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      errors.emplace_back(message.str(), position);
    }